

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pass2.cpp
# Opt level: O1

void __thiscall cs222::Pass2::readSymbols(Pass2 *this)

{
  pointer pcVar1;
  long lVar2;
  mapped_type mVar3;
  char cVar4;
  mapped_type *pmVar5;
  runtime_error *this_00;
  _Alloc_hider _Var6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  string litTabPath;
  int address_1;
  string symTabPath;
  int address;
  stringstream buf;
  ifstream ifs;
  key_type local_428;
  mapped_type local_404;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  key_type local_3e0;
  undefined1 local_3c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0;
  byte abStack_3a0 [96];
  ios_base local_340 [264];
  long local_238 [2];
  streambuf local_228 [16];
  byte abStack_218 [488];
  
  local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
  pcVar1 = (this->srcFileName)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,pcVar1,pcVar1 + (this->srcFileName)._M_string_length);
  std::__cxx11::string::append((char *)&local_400);
  std::ifstream::ifstream(local_238,(string *)&local_400,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"Cannot open file: ","");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0,
                   &local_428,&local_400);
    std::runtime_error::runtime_error(this_00,(string *)local_3c0);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0,
                 "Reading SYMTAB from ",&local_400);
  logDebug((string *)local_3c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_3c0 + 0x10)) {
    operator_delete((void *)local_3c0._0_8_,local_3b0._M_allocated_capacity + 1);
  }
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 != '\0') {
    local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
    local_428._M_string_length = 0;
    local_428.field_2._M_local_buf[0] = '\0';
    std::__cxx11::stringstream::stringstream((stringstream *)local_3c0);
    std::ostream::operator<<((ostream *)(local_3c0 + 0x10),local_228);
    std::ifstream::close();
    std::operator>>((istream *)local_3c0,(string *)&local_428);
    std::operator>>((istream *)local_3c0,(string *)&local_428);
    if ((abStack_3a0[*(long *)(local_3c0._0_8_ + -0x18)] & 5) == 0) {
      do {
        std::operator>>((istream *)local_3c0,(string *)&local_428);
        lVar2 = *(long *)(local_3c0._0_8_ + -0x18);
        if ((abStack_3a0[lVar2] & 5) != 0) break;
        *(uint *)(abStack_3a0 + lVar2 + -8) = *(uint *)(abStack_3a0 + lVar2 + -8) & 0xffffffb5 | 8;
        std::istream::operator>>((istream *)local_3c0,(int *)&local_3e0);
        if ((abStack_3a0[*(long *)(local_3c0._0_8_ + -0x18)] & 5) != 0) break;
        mVar3 = (mapped_type)local_3e0._M_dataplus._M_p;
        pmVar5 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&this->symTab,&local_428);
        *pmVar5 = mVar3;
      } while ((abStack_3a0[*(long *)(local_3c0._0_8_ + -0x18)] & 5) == 0);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_3c0);
    std::ios_base::~ios_base(local_340);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428._M_dataplus._M_p != &local_428.field_2) {
      operator_delete(local_428._M_dataplus._M_p,
                      CONCAT71(local_428.field_2._M_allocated_capacity._1_7_,
                               local_428.field_2._M_local_buf[0]) + 1);
    }
  }
  paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_3c0 + 0x10);
  pcVar1 = (this->srcFileName)._M_dataplus._M_p;
  local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_428,pcVar1,pcVar1 + (this->srcFileName)._M_string_length);
  std::__cxx11::string::append((char *)&local_428);
  std::ifstream::open((string *)local_238,(_Ios_Openmode)&local_428);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0,
                   "Reading LITTAB from ",&local_428);
    logDebug((string *)local_3c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._0_8_ != paVar7) {
      operator_delete((void *)local_3c0._0_8_,local_3b0._M_allocated_capacity + 1);
    }
    cVar4 = std::__basic_file<char>::is_open();
    if (cVar4 == '\0') goto LAB_0011b55e;
    local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
    local_3e0._M_string_length = 0;
    local_3e0.field_2._M_local_buf[0] = '\0';
    std::__cxx11::stringstream::stringstream((stringstream *)local_3c0);
    std::ostream::operator<<((ostream *)(local_3c0 + 0x10),local_228);
    std::ifstream::close();
    std::operator>>((istream *)local_3c0,(string *)&local_3e0);
    std::operator>>((istream *)local_3c0,(string *)&local_3e0);
    if ((abStack_3a0[*(long *)(local_3c0._0_8_ + -0x18)] & 5) == 0) {
      do {
        std::operator>>((istream *)local_3c0,(string *)&local_3e0);
        lVar2 = *(long *)(local_3c0._0_8_ + -0x18);
        if ((abStack_3a0[lVar2] & 5) != 0) break;
        *(uint *)(abStack_3a0 + lVar2 + -8) = *(uint *)(abStack_3a0 + lVar2 + -8) & 0xffffffb5 | 8;
        std::istream::operator>>((istream *)local_3c0,&local_404);
        mVar3 = local_404;
        if ((abStack_3a0[*(long *)(local_3c0._0_8_ + -0x18)] & 5) != 0) break;
        pmVar5 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&this->litTab,&local_3e0);
        *pmVar5 = mVar3;
      } while ((abStack_3a0[*(long *)(local_3c0._0_8_ + -0x18)] & 5) == 0);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_3c0);
    std::ios_base::~ios_base(local_340);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p == &local_3e0.field_2) goto LAB_0011b55e;
    local_3b0._M_allocated_capacity =
         CONCAT71(local_3e0.field_2._M_allocated_capacity._1_7_,local_3e0.field_2._M_local_buf[0]);
    _Var6._M_p = local_3e0._M_dataplus._M_p;
  }
  else {
    local_3c0._0_8_ = paVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3c0,"No LITTAB present","");
    logDebug((string *)local_3c0);
    _Var6._M_p = (pointer)local_3c0._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._0_8_ == paVar7) goto LAB_0011b55e;
  }
  operator_delete(_Var6._M_p,local_3b0._M_allocated_capacity + 1);
LAB_0011b55e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != &local_428.field_2) {
    operator_delete(local_428._M_dataplus._M_p,
                    CONCAT71(local_428.field_2._M_allocated_capacity._1_7_,
                             local_428.field_2._M_local_buf[0]) + 1);
  }
  std::ifstream::~ifstream(local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._M_dataplus._M_p != &local_400.field_2) {
    operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Pass2::readSymbols() {
        // reading from symTab
        std::string symTabPath = srcFileName + ".symtab";
        std::ifstream ifs(symTabPath);

        if (!ifs)
            throw std::runtime_error(std::string("Cannot open file: ") + symTabPath);

        logDebug("Reading SYMTAB from " + symTabPath);

        if (ifs.is_open()) {

            std::string key;
            int address;
            std::stringstream buf;

            buf << ifs.rdbuf();

            ifs.close();

            // ignoring SYMBOL & ADDRESS
            buf >> key;
            buf >> key;

            while (buf)
            {
                buf >> key;
                if (!buf)
                    break;
                //std::cout << key << "\t";

                buf >> std::hex >> address;
                if (!buf)
                    break;
                //std::cout << std::hex << address << std::endl;

                symTab[key] = address;
            }
        }

        //reading from litTab
        std::string litTabPath = srcFileName + ".littab";

        ifs.open(litTabPath);

        if (!ifs){
            logDebug("No LITTAB present");
            return;
        }

        logDebug("Reading LITTAB from " + litTabPath);

        if (ifs.is_open()) {

            std::string key;
            int address;
            std::stringstream buf;

            buf << ifs.rdbuf();
            ifs.close();

            // ignoring SYMBOL & ADDRESS
            buf >> key;
            buf >> key;

            while (buf)
            {
                buf >> key;
                if (!buf)
                    break;
                //std::cout << key << "\t";

                buf >> std::hex >> address;
                if (!buf)
                    break;
                //std::cout << std::hex << address << std::endl;

                litTab[key] = address;
            }
        }

    }